

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nucleus.cxx
# Opt level: O0

void __thiscall trento::WoodsSaxonNucleus::sample_nucleons_impl(WoodsSaxonNucleus *this)

{
  bool bVar1;
  const_iterator in_RDI;
  double __x;
  double dVar2;
  undefined1 auVar3 [16];
  double z;
  double y;
  double x;
  double r_sin_theta;
  double phi;
  double cos_theta;
  int ntries;
  double *r_1;
  iterator nucleon;
  const_iterator r_iter;
  double *r;
  iterator __end1;
  iterator __begin1;
  vector<double,_std::allocator<double>_> *__range1;
  vector<double,_std::allocator<double>_> radii;
  undefined6 in_stack_fffffffffffffed8;
  undefined1 in_stack_fffffffffffffede;
  undefined1 in_stack_fffffffffffffedf;
  piecewise_linear_distribution<double> *in_stack_fffffffffffffee0;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffee8;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffef0;
  size_type in_stack_fffffffffffffef8;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff00;
  MinDistNucleus *in_stack_ffffffffffffff10;
  int local_94;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> local_90;
  reference local_88;
  NucleonData *local_80;
  __normal_iterator<trento::NucleonData_*,_std::vector<trento::NucleonData,_std::allocator<trento::NucleonData>_>_>
  local_78;
  double *local_70;
  double *local_68;
  double *local_60;
  reference local_58;
  double *local_50;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_48;
  undefined1 *local_40;
  undefined1 local_20 [32];
  
  Nucleus::size((Nucleus *)0x1432b1);
  std::allocator<double>::allocator((allocator<double> *)0x1432c8);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
             (allocator_type *)in_stack_fffffffffffffef0._M_current);
  std::allocator<double>::~allocator((allocator<double> *)0x1432ee);
  local_40 = local_20;
  local_48._M_current =
       (double *)
       std::vector<double,_std::allocator<double>_>::begin
                 ((vector<double,_std::allocator<double>_> *)
                  CONCAT17(in_stack_fffffffffffffedf,
                           CONCAT16(in_stack_fffffffffffffede,in_stack_fffffffffffffed8)));
  local_50 = (double *)
             std::vector<double,_std::allocator<double>_>::end
                       ((vector<double,_std::allocator<double>_> *)
                        CONCAT17(in_stack_fffffffffffffedf,
                                 CONCAT16(in_stack_fffffffffffffede,in_stack_fffffffffffffed8)));
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *
                       )in_stack_fffffffffffffee0,
                       (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *
                       )CONCAT17(in_stack_fffffffffffffedf,
                                 CONCAT16(in_stack_fffffffffffffede,in_stack_fffffffffffffed8)));
    if (!bVar1) break;
    local_58 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
               ::operator*(&local_48);
    in_stack_ffffffffffffff10 =
         (MinDistNucleus *)
         std::piecewise_linear_distribution<double>::operator()
                   (in_stack_fffffffffffffee0,
                    (mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                     *)CONCAT17(in_stack_fffffffffffffedf,
                                CONCAT16(in_stack_fffffffffffffede,in_stack_fffffffffffffed8)));
    *local_58 = (double)in_stack_ffffffffffffff10;
    __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++(&local_48);
  }
  local_60 = (double *)
             std::vector<double,_std::allocator<double>_>::begin
                       ((vector<double,_std::allocator<double>_> *)
                        CONCAT17(in_stack_fffffffffffffedf,
                                 CONCAT16(in_stack_fffffffffffffede,in_stack_fffffffffffffed8)));
  local_68 = (double *)
             std::vector<double,_std::allocator<double>_>::end
                       ((vector<double,_std::allocator<double>_> *)
                        CONCAT17(in_stack_fffffffffffffedf,
                                 CONCAT16(in_stack_fffffffffffffede,in_stack_fffffffffffffed8)));
  std::sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  local_70 = (double *)
             std::vector<double,_std::allocator<double>_>::cbegin
                       ((vector<double,_std::allocator<double>_> *)
                        CONCAT17(in_stack_fffffffffffffedf,
                                 CONCAT16(in_stack_fffffffffffffede,in_stack_fffffffffffffed8)));
  local_78._M_current =
       (NucleonData *)
       Nucleus::begin((Nucleus *)
                      CONCAT17(in_stack_fffffffffffffedf,
                               CONCAT16(in_stack_fffffffffffffede,in_stack_fffffffffffffed8)));
  while( true ) {
    local_80 = (NucleonData *)
               Nucleus::end((Nucleus *)
                            CONCAT17(in_stack_fffffffffffffedf,
                                     CONCAT16(in_stack_fffffffffffffede,in_stack_fffffffffffffed8)))
    ;
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<trento::NucleonData_*,_std::vector<trento::NucleonData,_std::allocator<trento::NucleonData>_>_>
                        *)in_stack_fffffffffffffee0,
                       (__normal_iterator<trento::NucleonData_*,_std::vector<trento::NucleonData,_std::allocator<trento::NucleonData>_>_>
                        *)CONCAT17(in_stack_fffffffffffffedf,
                                   CONCAT16(in_stack_fffffffffffffede,in_stack_fffffffffffffed8)));
    if (!bVar1) break;
    local_90 = __gnu_cxx::
               __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
               operator++(in_stack_fffffffffffffee8._M_current,
                          (int)((ulong)in_stack_fffffffffffffee0 >> 0x20));
    local_88 = __gnu_cxx::
               __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
               operator*(&local_90);
    local_94 = 0;
    do {
      auVar3._0_8_ = random::cos_theta<double>();
      __x = random::phi<double>();
      in_stack_fffffffffffffee0 = (piecewise_linear_distribution<double> *)*local_88;
      auVar3._8_8_ = 0;
      auVar3 = vfnmadd213sd_fma(auVar3,auVar3,ZEXT816(0x3ff0000000000000));
      dVar2 = sqrt(auVar3._0_8_);
      in_stack_fffffffffffffef0._M_current = (double *)((double)in_stack_fffffffffffffee0 * dVar2);
      in_stack_fffffffffffffee8._M_current = in_stack_fffffffffffffef0._M_current;
      cos(__x);
      sin(__x);
      __gnu_cxx::
      __normal_iterator<trento::NucleonData_*,_std::vector<trento::NucleonData,_std::allocator<trento::NucleonData>_>_>
      ::operator*(&local_78);
      Nucleus::set_nucleon_position
                ((Nucleus *)in_stack_fffffffffffffef0._M_current,
                 (NucleonData *)in_stack_fffffffffffffee8._M_current,
                 (double)in_stack_fffffffffffffee0,
                 (double)CONCAT17(in_stack_fffffffffffffedf,
                                  CONCAT16(in_stack_fffffffffffffede,in_stack_fffffffffffffed8)),
                 6.54390936048023e-318);
      local_94 = local_94 + 1;
      in_stack_fffffffffffffedf = false;
      if (local_94 < 1000) {
        __gnu_cxx::
        __normal_iterator<trento::NucleonData_const*,std::vector<trento::NucleonData,std::allocator<trento::NucleonData>>>
        ::__normal_iterator<trento::NucleonData*>
                  ((__normal_iterator<const_trento::NucleonData_*,_std::vector<trento::NucleonData,_std::allocator<trento::NucleonData>_>_>
                    *)in_stack_fffffffffffffee0,
                   (__normal_iterator<trento::NucleonData_*,_std::vector<trento::NucleonData,_std::allocator<trento::NucleonData>_>_>
                    *)(ulong)CONCAT16(in_stack_fffffffffffffede,in_stack_fffffffffffffed8));
        in_stack_fffffffffffffede = MinDistNucleus::is_too_close(in_stack_ffffffffffffff10,in_RDI);
        in_stack_fffffffffffffedf = in_stack_fffffffffffffede;
      }
    } while ((bool)in_stack_fffffffffffffedf != false);
    __gnu_cxx::
    __normal_iterator<trento::NucleonData_*,_std::vector<trento::NucleonData,_std::allocator<trento::NucleonData>_>_>
    ::operator++(&local_78);
  }
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffef0._M_current);
  return;
}

Assistant:

void WoodsSaxonNucleus::sample_nucleons_impl() {
  // When placing nucleons with a minimum distance criterion, resample spherical
  // angles until the nucleon is not too close to a previously sampled nucleon,
  // but do not resample radius -- this could modify the Woods-Saxon dist.

  // Because of the r^2 Jacobian, there is less available space at smaller
  // radii.  Therefore, pre-sample all radii first, sort them, and then place
  // nucleons starting with the smallest radius and working outwards.  This
  // dramatically reduces the chance that a nucleon cannot be placed.
  std::vector<double> radii(size());
  for (auto&& r : radii)
    r = woods_saxon_dist_(random::engine);
  std::sort(radii.begin(), radii.end());

  // Place each nucleon at a pre-sampled radius.
  auto r_iter = radii.cbegin();
  for (iterator nucleon = begin(); nucleon != end(); ++nucleon) {
    // Get radius and advance iterator.
    auto& r = *r_iter++;

    // Sample angles until the minimum distance criterion is satisfied.
    auto ntries = 0;
    do {
      // Sample isotropic spherical angles.
      auto cos_theta = random::cos_theta<double>();
      auto phi = random::phi<double>();

      // Convert to Cartesian coordinates.
      auto r_sin_theta = r * std::sqrt(1. - cos_theta*cos_theta);
      auto x = r_sin_theta * std::cos(phi);
      auto y = r_sin_theta * std::sin(phi);
      auto z = r * cos_theta;

      set_nucleon_position(*nucleon, x, y, z);

      // Retry sampling a reasonable number of times.  If a nucleon cannot be
      // placed, give up and leave it at its last sampled position.  Some
      // approximate numbers for Pb nuclei:
      //
      //   dmin = 0.5 fm, < 0.001% of nucleons cannot be placed
      //          1.0 fm, ~0.005%
      //          1.5 fm, ~0.1%
      //          1.73 fm, ~1%
    } while (++ntries < 1000 && is_too_close(nucleon));
  }
  // XXX: re-center nucleon positions?
}